

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertLight(FBXConverter *this,Light *light,string *orig_name)

{
  ai_real _r;
  undefined8 uVar1;
  ai_real _g;
  Type TVar2;
  Decay DVar3;
  aiLight *this_00;
  reference ppaVar4;
  float fVar5;
  aiVector3D aVar6;
  float fStack_90;
  float decay;
  float local_88;
  aiVector3t<float> local_84;
  aiVector3t<float> local_78;
  aiColor3D local_6c;
  aiVector3D local_60;
  undefined8 local_50;
  ai_real local_48;
  undefined8 *local_40;
  aiVector3D *col;
  value_type paStack_30;
  float intensity;
  aiLight *out_light;
  string *local_20;
  string *orig_name_local;
  Light *light_local;
  FBXConverter *this_local;
  
  local_20 = orig_name;
  orig_name_local = (string *)light;
  light_local = (Light *)this;
  this_00 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(this_00);
  out_light = this_00;
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back(&this->lights,&out_light);
  ppaVar4 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::back(&this->lights);
  paStack_30 = *ppaVar4;
  aiString::Set(&paStack_30->mName,local_20);
  fVar5 = Light::Intensity((Light *)orig_name_local);
  col._4_4_ = fVar5 / 100.0;
  aVar6 = Light::Color((Light *)orig_name_local);
  local_60.z = aVar6.z;
  local_48 = local_60.z;
  local_60._0_8_ = aVar6._0_8_;
  local_50._0_4_ = local_60.x;
  local_50._4_4_ = local_60.y;
  uVar1 = local_50;
  local_40 = &local_50;
  local_50._0_4_ = aVar6.x;
  _r = (ai_real)local_50;
  local_50._4_4_ = aVar6.y;
  _g = local_50._4_4_;
  fVar5 = local_60.z;
  local_60 = aVar6;
  local_50 = uVar1;
  aiColor3D::aiColor3D(&local_6c,_r,_g,fVar5);
  aiColor3D::operator=(&paStack_30->mColorDiffuse,&local_6c);
  (paStack_30->mColorDiffuse).r = (paStack_30->mColorDiffuse).r * col._4_4_;
  (paStack_30->mColorDiffuse).g = (paStack_30->mColorDiffuse).g * col._4_4_;
  (paStack_30->mColorDiffuse).b = (paStack_30->mColorDiffuse).b * col._4_4_;
  aiColor3D::operator=(&paStack_30->mColorSpecular,&paStack_30->mColorDiffuse);
  aiVector3t<float>::aiVector3t(&local_78,0.0);
  (paStack_30->mPosition).z = local_78.z;
  (paStack_30->mPosition).x = local_78.x;
  (paStack_30->mPosition).y = local_78.y;
  aiVector3t<float>::aiVector3t(&local_84,0.0,-1.0,0.0);
  (paStack_30->mDirection).z = local_84.z;
  (paStack_30->mDirection).x = local_84.x;
  (paStack_30->mDirection).y = local_84.y;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&stack0xffffffffffffff70,0.0,0.0,-1.0);
  (paStack_30->mUp).z = local_88;
  (paStack_30->mUp).x = fStack_90;
  (paStack_30->mUp).y = decay;
  TVar2 = Light::LightType((Light *)orig_name_local);
  switch(TVar2) {
  case Type_Point:
    paStack_30->mType = aiLightSource_POINT;
    break;
  case Type_Directional:
    paStack_30->mType = aiLightSource_DIRECTIONAL;
    break;
  case Type_Spot:
    paStack_30->mType = aiLightSource_SPOT;
    fVar5 = Light::OuterAngle((Light *)orig_name_local);
    paStack_30->mAngleOuterCone = fVar5 * 0.017453292;
    fVar5 = Light::InnerAngle((Light *)orig_name_local);
    paStack_30->mAngleInnerCone = fVar5 * 0.017453292;
    break;
  case Type_Area:
    LogFunctions<Assimp::FBXImporter>::LogWarn("cannot represent area light, set to UNDEFINED");
    paStack_30->mType = aiLightSource_UNDEFINED;
    break;
  case Type_Volume:
    LogFunctions<Assimp::FBXImporter>::LogWarn("cannot represent volume light, set to UNDEFINED");
    paStack_30->mType = aiLightSource_UNDEFINED;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x17e,
                  "void Assimp::FBX::FBXConverter::ConvertLight(const Light &, const std::string &)"
                 );
  }
  fVar5 = Light::DecayStart((Light *)orig_name_local);
  DVar3 = Light::DecayType((Light *)orig_name_local);
  switch(DVar3) {
  case Decay_None:
    paStack_30->mAttenuationConstant = fVar5;
    paStack_30->mAttenuationLinear = 0.0;
    paStack_30->mAttenuationQuadratic = 0.0;
    break;
  case Decay_Linear:
    paStack_30->mAttenuationConstant = 0.0;
    paStack_30->mAttenuationLinear = 2.0 / fVar5;
    paStack_30->mAttenuationQuadratic = 0.0;
    break;
  case Decay_Quadratic:
    paStack_30->mAttenuationConstant = 0.0;
    paStack_30->mAttenuationLinear = 0.0;
    paStack_30->mAttenuationQuadratic = 2.0 / (fVar5 * fVar5);
    break;
  case Decay_Cubic:
    LogFunctions<Assimp::FBXImporter>::LogWarn
              ("cannot represent cubic attenuation, set to Quadratic");
    paStack_30->mAttenuationQuadratic = 1.0;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x198,
                  "void Assimp::FBX::FBXConverter::ConvertLight(const Light &, const std::string &)"
                 );
  }
  return;
}

Assistant:

void FBXConverter::ConvertLight(const Light& light, const std::string &orig_name) {
            lights.push_back(new aiLight());
            aiLight* const out_light = lights.back();

            out_light->mName.Set(orig_name);

            const float intensity = light.Intensity() / 100.0f;
            const aiVector3D& col = light.Color();

            out_light->mColorDiffuse = aiColor3D(col.x, col.y, col.z);
            out_light->mColorDiffuse.r *= intensity;
            out_light->mColorDiffuse.g *= intensity;
            out_light->mColorDiffuse.b *= intensity;

            out_light->mColorSpecular = out_light->mColorDiffuse;

            //lights are defined along negative y direction
            out_light->mPosition = aiVector3D(0.0f);
            out_light->mDirection = aiVector3D(0.0f, -1.0f, 0.0f);
            out_light->mUp = aiVector3D(0.0f, 0.0f, -1.0f);

            switch (light.LightType())
            {
            case Light::Type_Point:
                out_light->mType = aiLightSource_POINT;
                break;

            case Light::Type_Directional:
                out_light->mType = aiLightSource_DIRECTIONAL;
                break;

            case Light::Type_Spot:
                out_light->mType = aiLightSource_SPOT;
                out_light->mAngleOuterCone = AI_DEG_TO_RAD(light.OuterAngle());
                out_light->mAngleInnerCone = AI_DEG_TO_RAD(light.InnerAngle());
                break;

            case Light::Type_Area:
                FBXImporter::LogWarn("cannot represent area light, set to UNDEFINED");
                out_light->mType = aiLightSource_UNDEFINED;
                break;

            case Light::Type_Volume:
                FBXImporter::LogWarn("cannot represent volume light, set to UNDEFINED");
                out_light->mType = aiLightSource_UNDEFINED;
                break;
            default:
                ai_assert(false);
            }

            float decay = light.DecayStart();
            switch (light.DecayType())
            {
            case Light::Decay_None:
                out_light->mAttenuationConstant = decay;
                out_light->mAttenuationLinear = 0.0f;
                out_light->mAttenuationQuadratic = 0.0f;
                break;
            case Light::Decay_Linear:
                out_light->mAttenuationConstant = 0.0f;
                out_light->mAttenuationLinear = 2.0f / decay;
                out_light->mAttenuationQuadratic = 0.0f;
                break;
            case Light::Decay_Quadratic:
                out_light->mAttenuationConstant = 0.0f;
                out_light->mAttenuationLinear = 0.0f;
                out_light->mAttenuationQuadratic = 2.0f / (decay * decay);
                break;
            case Light::Decay_Cubic:
                FBXImporter::LogWarn("cannot represent cubic attenuation, set to Quadratic");
                out_light->mAttenuationQuadratic = 1.0f;
                break;
            default:
                ai_assert(false);
                break;
            }
        }